

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::InsideExpression::visitExprs<slang::ast::SpecifyConditionVisitor&>
          (InsideExpression *this,SpecifyConditionVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  
  Expression::visit<slang::ast::SpecifyConditionVisitor&>(this->left_,visitor);
  ppEVar1 = (this->rangeList_)._M_ptr;
  sVar2 = (this->rangeList_)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::SpecifyConditionVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto range : rangeList())
            range->visit(visitor);
    }